

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.hpp
# Opt level: O2

long duckdb::DecimalMultiplyOverflowCheck::Operation<long,long,long>(long left,long right)

{
  long lVar1;
  OutOfRangeException *this;
  allocator local_41;
  string local_40;
  
  lVar1 = left * right;
  if ((SEXT816(lVar1) == SEXT816(left) * SEXT816(right)) &&
     (0xe43e9298b1380000 < lVar1 + 0xf21f494c589c0000U)) {
    return lVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,
             "Overflow in multiplication of DECIMAL(18) (%d * %d). You might want to add an explicit cast to a bigger decimal."
             ,&local_41);
  OutOfRangeException::OutOfRangeException<long,long>(this,&local_40,left,right);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TryDecimalMultiply::Operation<TA, TB, TR>(left, right, result)) {
			throw OutOfRangeException("Overflow in multiplication of DECIMAL(18) (%d * %d). You might want to add an "
			                          "explicit cast to a bigger decimal.",
			                          left, right);
		}
		return result;
	}